

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
FixedGenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
::doApply(IRet *__return_storage_ptr__,
         FixedGenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
         *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long *plVar2;
  long lVar3;
  undefined8 local_68;
  double dStack_60;
  undefined8 local_58;
  bool *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Void *local_38;
  
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0;
  do {
    (&__return_storage_ptr__->m_data[0].m_hasNaN)[lVar3] = false;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_lo + lVar3) = 0x7ff0000000000000;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x18);
  plVar2 = (long *)(**(code **)(*(long *)this + 0x58))(this);
  lVar3 = 0;
  do {
    local_50 = &iargs->a->m_data[0].m_hasNaN + lVar3;
    local_48 = *(undefined4 *)&iargs->b;
    uStack_44 = *(undefined4 *)((long)&iargs->b + 4);
    uStack_40 = *(undefined4 *)&iargs->c;
    uStack_3c = *(undefined4 *)((long)&iargs->c + 4);
    local_38 = iargs->d;
    (**(code **)(*plVar2 + 0x40))(&local_68,plVar2,ctx,&local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar3) = local_58;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = local_68;
    *(double *)(pbVar1 + 8) = dStack_60;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x18);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext& ctx,
												 const IArgs&		iargs) const
	{
		IRet				ret;
		const Func<Sig_>&	func	= this->doGetScalarFunc();

		for (int ndx = 0; ndx < Size; ++ndx)
			ret[ndx] = func.apply(ctx, iargs.a[ndx], iargs.b, iargs.c[ndx], iargs.d[ndx]);

		return ret;
	}